

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_ElevationGrid(X3DImporter *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  FIReader *pFVar4;
  char *pcVar5;
  CX3DImporter_NodeElement *pCVar6;
  pointer pcVar7;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int32_t iVar12;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _List_node_base *p_Var13;
  runtime_error *prVar14;
  string *psVar15;
  uint pAttrIdx;
  ulong uVar16;
  int32_t xi;
  int iVar17;
  float fVar18;
  float fVar19;
  pointer pcVar20;
  char *__end;
  pointer pfVar21;
  string an;
  CX3DImporter_NodeElement *ne;
  string def;
  string use;
  vector<float,_std::allocator<float>_> height;
  bool local_ec;
  bool local_eb;
  bool local_ea;
  bool local_e9;
  string local_e0;
  int32_t local_bc;
  float local_b8;
  float local_b4;
  ulong local_b0;
  CX3DImporter_NodeElement *local_a8;
  string local_a0;
  string local_80;
  float local_5c;
  float local_58;
  allocator<char> local_51;
  ulong local_50;
  vector<float,_std::allocator<float>_> local_48;
  undefined4 extraout_var_00;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8 = (CX3DImporter_NodeElement *)0x0;
  uVar10 = (*(((this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
             super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar10 < 1) {
    local_b0 = 0;
    local_ea = true;
    local_5c = 0.0;
    local_bc = 0;
    local_b4 = 1.0;
    local_b8 = 1.0;
    local_ec = true;
    local_eb = true;
    local_e9 = true;
  }
  else {
    pAttrIdx = 0;
    local_5c = 0.0;
    local_e9 = true;
    local_eb = true;
    local_ec = true;
    local_ea = true;
    local_b8 = 1.0;
    local_b4 = 1.0;
    local_bc = 0;
    local_b0 = 0;
    do {
      pFVar4 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar11 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                         (pFVar4,(ulong)pAttrIdx);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,(char *)CONCAT44(extraout_var,iVar11),&local_51);
      iVar11 = std::__cxx11::string::compare((char *)&local_e0);
      if (iVar11 == 0) {
        iVar11 = (*(((this->mReader)._M_t.
                     super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                     .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                   super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar11);
        psVar15 = &local_a0;
LAB_006ae70c:
        pcVar5 = (char *)psVar15->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar15,0,pcVar5,(ulong)__s);
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)&local_e0);
        if (iVar11 == 0) {
          iVar11 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar11);
          psVar15 = &local_80;
          goto LAB_006ae70c;
        }
        iVar11 = std::__cxx11::string::compare((char *)&local_e0);
        if (((iVar11 != 0) &&
            (iVar11 = std::__cxx11::string::compare((char *)&local_e0), iVar11 != 0)) &&
           (iVar11 = std::__cxx11::string::compare((char *)&local_e0), iVar11 != 0)) {
          iVar11 = std::__cxx11::string::compare((char *)&local_e0);
          if (iVar11 == 0) {
            local_ea = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)&local_e0);
            if (iVar11 == 0) {
              local_e9 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
            }
            else {
              iVar11 = std::__cxx11::string::compare((char *)&local_e0);
              if (iVar11 == 0) {
                local_eb = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)&local_e0);
                if (iVar11 == 0) {
                  local_ec = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                }
                else {
                  iVar11 = std::__cxx11::string::compare((char *)&local_e0);
                  if (iVar11 == 0) {
                    local_5c = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                  }
                  else {
                    iVar11 = std::__cxx11::string::compare((char *)&local_e0);
                    if (iVar11 == 0) {
                      XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,&local_48);
                    }
                    else {
                      iVar11 = std::__cxx11::string::compare((char *)&local_e0);
                      if (iVar11 == 0) {
                        iVar12 = XML_ReadNode_GetAttrVal_AsI32(this,pAttrIdx);
                        local_b0 = CONCAT44(extraout_var_02,iVar12);
                      }
                      else {
                        iVar11 = std::__cxx11::string::compare((char *)&local_e0);
                        if (iVar11 == 0) {
                          local_b4 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                        }
                        else {
                          iVar11 = std::__cxx11::string::compare((char *)&local_e0);
                          if (iVar11 == 0) {
                            local_bc = XML_ReadNode_GetAttrVal_AsI32(this,pAttrIdx);
                          }
                          else {
                            iVar11 = std::__cxx11::string::compare((char *)&local_e0);
                            if (iVar11 == 0) {
                              local_b8 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                            }
                            else {
                              Throw_IncorrectAttr(this,&local_e0);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      pAttrIdx = pAttrIdx + 1;
    } while (uVar10 != pAttrIdx);
  }
  if (local_80._M_string_length == 0) {
    if (((local_b4 == 0.0) && (!NAN(local_b4))) || ((local_b8 == 0.0 && (!NAN(local_b8))))) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"Spacing in <ElevationGrid> must be grater than zero.","");
      std::runtime_error::runtime_error(prVar14,(string *)&local_e0);
      *(undefined ***)prVar14 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (((int)local_b0 < 1) || (local_bc < 1)) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"Dimension in <ElevationGrid> must be grater than zero.","");
      std::runtime_error::runtime_error(prVar14,(string *)&local_e0);
      *(undefined ***)prVar14 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != (ulong)(uint)(local_bc * (int)local_b0)) {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"Heights count must be equal to \"xDimension * zDimension\"",""
                );
      Throw_IncorrectAttrValue(this,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    local_a8 = (CX3DImporter_NodeElement *)operator_new(0x90);
    pCVar6 = this->NodeElement_Cur;
    local_a8->Type = ENET_ElevationGrid;
    (local_a8->ID)._M_dataplus._M_p = (pointer)&(local_a8->ID).field_2;
    (local_a8->ID)._M_string_length = 0;
    (local_a8->ID).field_2._M_local_buf[0] = '\0';
    local_a8->Parent = pCVar6;
    (local_a8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8->Child;
    (local_a8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8->Child;
    (local_a8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_a8[1]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_a8[1].Type = 0;
    *(CX3DImporter_NodeElement **)&local_a8[1].Type = local_a8 + 1;
    local_a8[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_a8 + 1);
    local_a8[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_a8[1].ID._M_string_length = 0;
    local_a8[1].ID.field_2._M_local_buf[0] = '\x01';
    local_a8->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_ElevationGrid_008ff888;
    *(undefined8 *)((long)&local_a8[1].ID.field_2 + 8) = 0;
    local_a8[1].Parent = (CX3DImporter_NodeElement *)0x0;
    local_a8[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    if (local_a0._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_a8->ID);
    }
    pCVar6 = local_a8;
    if (0 < local_bc) {
      iVar11 = 0;
      pfVar21 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (0 < (int)local_b0) {
          local_50 = CONCAT44(local_50._4_4_,(float)iVar11 * local_b8);
          iVar17 = 0;
          do {
            local_58 = *pfVar21;
            p_Var13 = (_List_node_base *)operator_new(0x20);
            *(float *)&p_Var13[1]._M_next = (float)iVar17 * local_b4;
            *(float *)((long)&p_Var13[1]._M_next + 4) = local_58;
            *(undefined4 *)&p_Var13[1]._M_prev = (undefined4)local_50;
            std::__detail::_List_node_base::_M_hook(p_Var13);
            pCVar6[1].ID._M_dataplus._M_p = pCVar6[1].ID._M_dataplus._M_p + 1;
            pfVar21 = pfVar21 + 1;
            iVar17 = iVar17 + 1;
          } while ((int)local_b0 != iVar17);
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 != local_bc);
    }
    if (local_bc < 2 || (int)local_b0 < 2) {
      local_a8[1].ID._M_string_length = 2;
      pcVar7 = pCVar6[1].ID._M_dataplus._M_p;
      if (pcVar7 != (pointer)0x1) {
        pvVar1 = (vector<int,_std::allocator<int>_> *)
                 (&pCVar6[1].ID.field_2._M_allocated_capacity + 1);
        pcVar20 = (pointer)0x0;
        do {
          local_e0._M_dataplus._M_p._0_4_ = (float)(int)pcVar20;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_e0);
          pcVar20 = pcVar20 + 1;
          local_e0._M_dataplus._M_p._0_4_ = SUB84(pcVar20,0);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_e0);
          local_e0._M_dataplus._M_p._0_4_ = -NAN;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_e0);
        } while (pcVar7 + -1 != pcVar20);
      }
    }
    else {
      local_a8[1].ID._M_string_length = 4;
      pvVar1 = (vector<int,_std::allocator<int>_> *)
               (&pCVar6[1].ID.field_2._M_allocated_capacity + 1);
      local_bc = local_bc + -2;
      local_b8 = (float)((int)local_b0 + -1);
      uVar10 = 0;
      fVar18 = 1.4013e-45;
      uVar16 = local_b0 & 0xffffffff;
      do {
        local_50 = (ulong)uVar10;
        local_b4 = (float)uVar16;
        fVar19 = local_b8;
        local_58 = fVar18;
        do {
          iVar11 = (int)uVar16;
          if (local_e9 == false) {
            local_e0._M_dataplus._M_p._0_4_ = (float)((int)fVar18 + -1);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_e0);
            local_e0._M_dataplus._M_p._0_4_ = fVar18;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_e0);
            local_e0._M_dataplus._M_p._0_4_ = (float)(iVar11 + 1);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_e0);
            local_e0._M_dataplus._M_p._0_4_ = (float)iVar11;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_e0);
          }
          else {
            local_e0._M_dataplus._M_p._0_4_ = (float)iVar11;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_e0);
            local_e0._M_dataplus._M_p._0_4_ = (float)(iVar11 + 1);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_e0);
            local_e0._M_dataplus._M_p._0_4_ = fVar18;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_e0);
            local_e0._M_dataplus._M_p._0_4_ = (float)((int)fVar18 + -1);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_e0);
          }
          local_e0._M_dataplus._M_p._0_4_ = -NAN;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1,(int *)&local_e0);
          uVar16 = (ulong)(iVar11 + 1);
          fVar18 = (float)((int)fVar18 + 1);
          fVar19 = (float)((int)fVar19 + -1);
        } while (fVar19 != 0.0);
        uVar10 = (int)local_50 + 1;
        uVar16 = (ulong)(uint)((int)local_b4 + (int)local_b0);
        fVar18 = (float)((int)local_58 + (int)local_b0);
      } while ((int)local_50 != local_bc);
    }
    pCVar6[1].ID.field_2._M_local_buf[2] = local_eb;
    pCVar6[1].ID.field_2._M_local_buf[1] = local_ec;
    *(float *)((long)&pCVar6[1].ID.field_2 + 4) = local_5c;
    pCVar6[1].ID.field_2._M_local_buf[0] = local_ea;
    iVar11 = (*(((this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
               super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar11 == '\0') {
      ParseHelper_Node_Enter(this,local_a8);
      paVar3 = &local_e0.field_2;
      do {
        do {
          while( true ) {
            iVar11 = (*(((this->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar11 == '\0') goto LAB_006aefc9;
            iVar17 = (*(((this->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar17 != 1) break;
            local_e0._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Color","");
            (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
            iVar11 = std::__cxx11::string::compare((char *)&local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != paVar3) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if (iVar11 == 0) {
              ParseNode_Rendering_Color(this);
            }
            else {
              local_e0._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ColorRGBA","");
              (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
              iVar11 = std::__cxx11::string::compare((char *)&local_e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != paVar3) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar11 == 0) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                local_e0._M_dataplus._M_p = (pointer)paVar3;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Normal","");
                (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                iVar11 = std::__cxx11::string::compare((char *)&local_e0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != paVar3) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                if (iVar11 == 0) {
                  ParseNode_Rendering_Normal(this);
                }
                else {
                  local_e0._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_e0,"TextureCoordinate","");
                  (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                  iVar11 = std::__cxx11::string::compare((char *)&local_e0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e0._M_dataplus._M_p != paVar3) {
                    operator_delete(local_e0._M_dataplus._M_p,
                                    local_e0.field_2._M_allocated_capacity + 1);
                  }
                  if (iVar11 == 0) {
                    ParseNode_Texturing_TextureCoordinate(this);
                  }
                  else {
                    bVar9 = ParseHelper_CheckRead_X3DMetadataObject(this);
                    if (!bVar9) {
                      local_e0._M_dataplus._M_p = (pointer)paVar3;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_e0,"ElevationGrid","");
                      XML_CheckNode_SkipUnsupported(this,&local_e0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e0._M_dataplus._M_p != paVar3) {
                        operator_delete(local_e0._M_dataplus._M_p,
                                        local_e0.field_2._M_allocated_capacity + 1);
                      }
                    }
                  }
                }
              }
            }
          }
          iVar17 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar17 != 2);
        local_e0._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ElevationGrid","");
        (*(((this->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar17 = std::__cxx11::string::compare((char *)&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar3) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
      } while (iVar17 != 0);
      if ((char)iVar11 == '\0') {
LAB_006aefc9:
        local_e0._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ElevationGrid","");
        Throw_CloseNotFound(this,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar3) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      pCVar6 = this->NodeElement_Cur;
      p_Var13 = (_List_node_base *)operator_new(0x18);
      p_Var13[1]._M_next = (_List_node_base *)local_a8;
      std::__detail::_List_node_base::_M_hook(p_Var13);
      psVar2 = &(pCVar6->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
    }
    p_Var13 = (_List_node_base *)operator_new(0x18);
    p_Var13[1]._M_next = (_List_node_base *)local_a8;
    std::__detail::_List_node_base::_M_hook(p_Var13);
    plVar8 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_a0._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar9 = FindNodeElement(this,&local_80,ENET_ElevationGrid,&local_a8);
    if (!bVar9) {
      Throw_USE_NotFound(this,&local_80);
    }
    pCVar6 = this->NodeElement_Cur;
    p_Var13 = (_List_node_base *)operator_new(0x18);
    p_Var13[1]._M_next = (_List_node_base *)local_a8;
    std::__detail::_List_node_base::_M_hook(p_Var13);
    plVar8 = &pCVar6->Child;
  }
  psVar2 = &(plVar8->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_ElevationGrid()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    float creaseAngle = 0;
    std::vector<float> height;
    bool normalPerVertex = true;
    bool solid = true;
    int32_t xDimension = 0;
    float xSpacing = 1;
    int32_t zDimension = 0;
    float zSpacing = 1;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("creaseAngle", creaseAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("height", height, XML_ReadNode_GetAttrVal_AsArrF);
		MACRO_ATTRREAD_CHECK_RET("xDimension", xDimension, XML_ReadNode_GetAttrVal_AsI32);
		MACRO_ATTRREAD_CHECK_RET("xSpacing", xSpacing, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("zDimension", zDimension, XML_ReadNode_GetAttrVal_AsI32);
		MACRO_ATTRREAD_CHECK_RET("zSpacing", zSpacing, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_ElevationGrid, ne);
	}
	else
	{
		if((xSpacing == 0.0f) || (zSpacing == 0.0f)) throw DeadlyImportError("Spacing in <ElevationGrid> must be grater than zero.");
		if((xDimension <= 0) || (zDimension <= 0)) throw DeadlyImportError("Dimension in <ElevationGrid> must be grater than zero.");
		if((size_t)(xDimension * zDimension) != height.size()) Throw_IncorrectAttrValue("Heights count must be equal to \"xDimension * zDimension\"");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_ElevationGrid(CX3DImporter_NodeElement::ENET_ElevationGrid, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_ElevationGrid& grid_alias = *((CX3DImporter_NodeElement_ElevationGrid*)ne);// create alias for conveience

		{// create grid vertices list
			std::vector<float>::const_iterator he_it = height.begin();

			for(int32_t zi = 0; zi < zDimension; zi++)// rows
			{
				for(int32_t xi = 0; xi < xDimension; xi++)// columns
				{
					aiVector3D tvec(xSpacing * xi, *he_it, zSpacing * zi);

					grid_alias.Vertices.push_back(tvec);
					++he_it;
				}
			}
		}// END: create grid vertices list
		//
		// create faces list. In "coordIdx" format
		//
		// check if we have quads
		if((xDimension < 2) || (zDimension < 2))// only one element in dimension is set, create line set.
		{
			((CX3DImporter_NodeElement_ElevationGrid*)ne)->NumIndices = 2;// will be holded as line set.
			for(size_t i = 0, i_e = (grid_alias.Vertices.size() - 1); i < i_e; i++)
			{
				grid_alias.CoordIdx.push_back(static_cast<int32_t>(i));
				grid_alias.CoordIdx.push_back(static_cast<int32_t>(i + 1));
				grid_alias.CoordIdx.push_back(-1);
			}
		}
		else// two or more elements in every dimension is set. create quad set.
		{
			((CX3DImporter_NodeElement_ElevationGrid*)ne)->NumIndices = 4;
			for(int32_t fzi = 0, fzi_e = (zDimension - 1); fzi < fzi_e; fzi++)// rows
			{
				for(int32_t fxi = 0, fxi_e = (xDimension - 1); fxi < fxi_e; fxi++)// columns
				{
					// points direction in face.
					if(ccw)
					{
						// CCW:
						//	3 2
						//	0 1
						grid_alias.CoordIdx.push_back((fzi + 1) * xDimension + fxi);
						grid_alias.CoordIdx.push_back((fzi + 1) * xDimension + (fxi + 1));
						grid_alias.CoordIdx.push_back(fzi * xDimension + (fxi + 1));
						grid_alias.CoordIdx.push_back(fzi * xDimension + fxi);
					}
					else
					{
						// CW:
						//	0 1
						//	3 2
						grid_alias.CoordIdx.push_back(fzi * xDimension + fxi);
						grid_alias.CoordIdx.push_back(fzi * xDimension + (fxi + 1));
						grid_alias.CoordIdx.push_back((fzi + 1) * xDimension + (fxi + 1));
						grid_alias.CoordIdx.push_back((fzi + 1) * xDimension + fxi);
					}// if(ccw) else

					grid_alias.CoordIdx.push_back(-1);
				}// for(int32_t fxi = 0, fxi_e = (xDimension - 1); fxi < fxi_e; fxi++)
			}// for(int32_t fzi = 0, fzi_e = (zDimension - 1); fzi < fzi_e; fzi++)
		}// if((xDimension < 2) || (zDimension < 2)) else

		grid_alias.ColorPerVertex = colorPerVertex;
		grid_alias.NormalPerVertex = normalPerVertex;
		grid_alias.CreaseAngle = creaseAngle;
		grid_alias.Solid = solid;
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("ElevationGrid");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("ElevationGrid");

			MACRO_NODECHECK_LOOPEND("ElevationGrid");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}// if(!mReader->isEmptyElement()) else

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}